

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.h
# Opt level: O3

String * String::number(String *__return_storage_ptr__,double num,size_t prec)

{
  int iVar1;
  char buf [32];
  char format [32];
  char local_58 [32];
  char local_38 [32];
  
  snprintf(local_38,0x20,"%%.%uf",prec);
  iVar1 = snprintf(local_58,0x20,local_38,num);
  String(__return_storage_ptr__,local_58,(long)iVar1);
  return __return_storage_ptr__;
}

Assistant:

static String number(double num, size_t prec = 2)
    {
        char format[32];

        // cast to unsigned because windows doesn't have %z format specifier
        snprintf(format, sizeof(format), "%%.%uf", (unsigned)prec);
        char buf[32];
        const size_t w = ::snprintf(buf, sizeof(buf), format, num);
        return String(buf, w);
    }